

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

boolean corpse_chance(monst *mon,monst *magr,boolean was_swallowed)

{
  int *piVar1;
  byte bVar2;
  ushort uVar3;
  permonst *pm;
  boolean bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  obj *poVar10;
  uint uVar11;
  char *line;
  int tmp;
  char kbuf [256];
  char local_138 [264];
  
  pm = mon->data;
  if ((pm == mons + 0xea) || (pm == mons + 0xdb || pm->mlet == '&')) {
    if (was_swallowed != '\0') {
      return '\0';
    }
    if ((viz_array[mon->my][mon->mx] & 2U) == 0) {
      return '\0';
    }
    pcVar8 = Monnam(mon);
    pcVar8 = s_suffix(pcVar8);
    line = "%s body crumbles into dust.";
    goto LAB_001ea72f;
  }
  lVar9 = 0x13;
  while (*(char *)((long)pm->mattk + lVar9 + -0x13) != '\x0e') {
    lVar9 = lVar9 + 4;
    if (lVar9 == 0x2b) {
      bVar4 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
      if ((bVar4 != '\0') ||
         (((((level->flags).field_0xa & 1) != 0 && ((pm->mflags2 & 2) != 0)) &&
          (uVar6 = mt_random(), 0x55555555 < uVar6 * -0x55555555)))) {
        return '\0';
      }
      bVar2 = pm->msize;
      if (pm == mons + 0x154 || 2 < bVar2) {
        return '\x01';
      }
      if (pm->mlet != '7') {
        if ((pm != mons + 0x145 && (pm != mons + 0x146 && pm != mons + 0x144)) &&
            (mons + 0x168 < pm || pm < mons + 0x159)) {
          uVar3 = pm->geno;
          uVar6 = mt_random();
          return uVar6 % ((bVar2 == 0) + 2 + (uint)((uVar3 & 6) == 0)) == 0;
        }
        return '\x01';
      }
      return '\x01';
    }
  }
  bVar2 = *(byte *)((long)pm->mattk + lVar9 + -0x11);
  uVar6 = (uint)bVar2;
  if (bVar2 == 0) {
    bVar2 = *(byte *)((long)&((permonst *)(pm->mattk + -4))->mname + lVar9);
    uVar6 = 0;
    if (bVar2 != 0) {
      uVar11 = (int)pm->mlevel + 1;
      for (uVar5 = uVar11; uVar5 != 0; uVar5 = uVar5 - 1) {
        uVar6 = mt_random();
        uVar11 = uVar11 + uVar6 % (uint)bVar2;
        uVar6 = uVar11;
      }
    }
  }
  else {
    bVar2 = *(byte *)((long)&((permonst *)(pm->mattk + -4))->mname + lVar9);
    uVar11 = uVar6;
    do {
      uVar5 = mt_random();
      uVar6 = uVar6 + uVar5 % (uint)bVar2;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  if (magr == (monst *)0x0 || was_swallowed == '\0') {
    pcVar8 = mons_mname(pm);
    pcVar8 = s_suffix(pcVar8);
    sprintf(local_138,"%s explosion",pcVar8);
    killer_format = 0;
    killer = local_138;
    explode((int)mon->mx,(int)mon->my,-1,uVar6,'\x14',1);
    return '\0';
  }
  if (magr == &youmonst) {
    pcVar8 = body_part(0x12);
    pline("There is an explosion in your %s!",pcVar8);
    pcVar8 = mons_mname(pm);
    pcVar8 = s_suffix(pcVar8);
    sprintf(local_138,"%s explosion",pcVar8);
    if (u.uprops[0x33].extrinsic != 0 || u.uprops[0x33].intrinsic != 0) {
      uVar6 = (int)((uVar6 - ((int)(uVar6 + 1) >> 0x1f)) + 1) >> 1;
    }
    losehp(uVar6,local_138,0);
    return '\0';
  }
  if (flags.soundok != '\0') {
    You_hear("an explosion.");
  }
  piVar1 = &magr->mhp;
  iVar7 = *piVar1;
  *piVar1 = *piVar1 - uVar6;
  if ((*piVar1 != 0 && SBORROW4(iVar7,uVar6) == *piVar1 < 0) || (mondied(magr), 0 < magr->mhp)) {
    if (magr->wormno == '\0') {
      if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001eaa84;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001eaa7b;
        }
        else {
LAB_001eaa7b:
          if (ublindf == (obj *)0x0) {
            return '\0';
          }
LAB_001eaa84:
          if (ublindf->oartifact != '\x1d') {
            return '\0';
          }
        }
        if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) {
          return '\0';
        }
        if ((viz_array[magr->my][magr->mx] & 1U) == 0) {
          return '\0';
        }
        if ((magr->data->mflags3 & 0x200) == 0) {
          return '\0';
        }
      }
    }
    else {
      bVar4 = worm_known(level,magr);
      if (bVar4 == '\0') {
        return '\0';
      }
    }
    uVar6 = *(uint *)&magr->field_0x60;
    if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar6 & 0x280) != 0) {
        return '\0';
      }
    }
    else {
      if ((uVar6 & 0x280) != 0) {
        return '\0';
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return '\0';
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return '\0';
    }
    pcVar8 = Monnam(magr);
    line = "%s seems to have indigestion.";
    goto LAB_001ea72f;
  }
  if (magr->wormno == '\0') {
    if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001eabcf;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001eabc6;
      }
      else {
LAB_001eabc6:
        if (ublindf == (obj *)0x0) goto LAB_001eac7f;
LAB_001eabcf:
        if (ublindf->oartifact != '\x1d') goto LAB_001eac7f;
      }
      if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
          (((youmonst.data)->mflags3 & 0x100) == 0)) ||
         (((viz_array[magr->my][magr->mx] & 1U) == 0 || ((magr->data->mflags3 & 0x200) == 0))))
      goto LAB_001eac7f;
    }
LAB_001eac2a:
    uVar6 = *(uint *)&magr->field_0x60;
    if ((((uVar6 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001eac72;
      goto LAB_001eac7f;
    }
    if ((uVar6 & 0x280) != 0) goto LAB_001eac7f;
LAB_001eac72:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_001eac7f;
  }
  else {
    bVar4 = worm_known(level,magr);
    if (bVar4 != '\0') goto LAB_001eac2a;
LAB_001eac7f:
    if (((magr->data->mflags1 & 0x10000) == 0) &&
       ((poVar10 = which_armor(magr,4), poVar10 == (obj *)0x0 ||
        (poVar10 = which_armor(magr,4), poVar10->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001eacd7;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001eacd2;
      }
      else {
LAB_001eacd2:
        if (ublindf != (obj *)0x0) {
LAB_001eacd7:
          if (ublindf->oartifact == '\x1d') goto LAB_001ead6a;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001eadd5;
      }
LAB_001ead6a:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar7 = dist2((int)magr->mx,(int)magr->my,(int)u.ux,(int)u.uy), iVar7 < 0x41))))
      goto LAB_001eadd5;
    }
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar4 = match_warn_of_mon(magr), bVar4 == '\0')))) {
      return '\0';
    }
  }
LAB_001eadd5:
  pcVar8 = Monnam(magr);
  line = "%s rips open!";
LAB_001ea72f:
  pline(line,pcVar8);
  return '\0';
}

Assistant:

boolean corpse_chance(struct monst *mon, 
		      struct monst *magr,	/* killer, if swallowed */
		      boolean was_swallowed)	/* digestion */
{
	const struct permonst *mdat = mon->data;
	int i, tmp;
	char kbuf[BUFSZ];

	if (mdat == &mons[PM_VLAD_THE_IMPALER] || mdat->mlet == S_LICH ||
	    mdat == &mons[PM_DISINTEGRATOR]) {
	    if (cansee(mon->mx, mon->my) && !was_swallowed)
		pline("%s body crumbles into dust.", s_suffix(Monnam(mon)));
	    return FALSE;
	}

	/* Gas spores always explode upon death */
	for (i = 0; i < NATTK; i++) {
	    if (mdat->mattk[i].aatyp == AT_BOOM) {
		if (mdat->mattk[i].damn)
		    tmp = dice((int)mdat->mattk[i].damn,
				(int)mdat->mattk[i].damd);
		else if (mdat->mattk[i].damd)
		    tmp = dice((int)mdat->mlevel+1, (int)mdat->mattk[i].damd);
		else tmp = 0;
		if (was_swallowed && magr) {
		    if (magr == &youmonst) {
			pline("There is an explosion in your %s!",
			      body_part(STOMACH));
			sprintf(kbuf, "%s explosion",
				s_suffix(mons_mname(mdat)));
			if (Half_physical_damage) tmp = (tmp+1) / 2;
			losehp(tmp, kbuf, KILLED_BY_AN);
		    } else {
			if (flags.soundok) You_hear("an explosion.");
			magr->mhp -= tmp;
			if (magr->mhp < 1) mondied(magr);
			if (magr->mhp < 1) { /* maybe lifesaved */
			    if (canspotmon(level, magr))
				pline("%s rips open!", Monnam(magr));
			} else if (canseemon(level, magr))
			    pline("%s seems to have indigestion.",
				  Monnam(magr));
		    }

		    return FALSE;
		}

		sprintf(kbuf, "%s explosion", s_suffix(mons_mname(mdat)));
		killer = kbuf;
		killer_format = KILLED_BY_AN;
		explode(mon->mx, mon->my, -1, tmp, MON_EXPLODE, EXPL_NOXIOUS);
		return FALSE;
	    }
	}

	/* must duplicate this below check in xkilled() since it results in
	 * creating no objects as well as no corpse
	 */
	if (LEVEL_SPECIFIC_NOCORPSE(mdat))
		return FALSE;

	if (bigmonst(mdat) || mdat == &mons[PM_LIZARD]
		   || is_golem(mdat)
		   || is_mplayer(mdat)
		   || is_rider(mdat))
		return TRUE;
	return (boolean) (!rn2((int)
		(2 + ((int)(mdat->geno & G_FREQ)<2) + verysmall(mdat))));
}